

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O3

void __thiscall luna::Closure::AddUpvalue(Closure *this,Upvalue *upvalue)

{
  pointer *pppUVar1;
  iterator __position;
  Upvalue *local_8;
  
  __position._M_current =
       (this->upvalues_).super__Vector_base<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->upvalues_).super__Vector_base<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = upvalue;
    std::vector<luna::Upvalue*,std::allocator<luna::Upvalue*>>::
    _M_realloc_insert<luna::Upvalue*const&>
              ((vector<luna::Upvalue*,std::allocator<luna::Upvalue*>> *)&this->upvalues_,__position,
               &local_8);
  }
  else {
    *__position._M_current = upvalue;
    pppUVar1 = &(this->upvalues_).
                super__Vector_base<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppUVar1 = *pppUVar1 + 1;
  }
  return;
}

Assistant:

void AddUpvalue(Upvalue *upvalue)
        { upvalues_.push_back(upvalue); }